

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void destroy_face(FT_Memory memory,FT_Face face,FT_Driver driver)

{
  FT_Driver_Class pFVar1;
  FT_Driver_Class clazz;
  FT_Driver driver_local;
  FT_Face face_local;
  FT_Memory memory_local;
  
  pFVar1 = driver->clazz;
  if ((face->autohint).finalizer != (FT_Generic_Finalizer)0x0) {
    (*(face->autohint).finalizer)((face->autohint).data);
  }
  while (face->glyph != (FT_GlyphSlot_conflict)0x0) {
    FT_Done_GlyphSlot(face->glyph);
  }
  FT_List_Finalize(&face->sizes_list,destroy_size,memory,driver);
  face->size = (FT_Size)0x0;
  if ((face->generic).finalizer != (FT_Generic_Finalizer)0x0) {
    (*(face->generic).finalizer)(face);
  }
  destroy_charmaps(face,memory);
  if (pFVar1->done_face != (FT_Face_DoneFunc)0x0) {
    (*pFVar1->done_face)(face);
  }
  FT_Stream_Free(face->stream,(uint)((face->face_flags & 0x400U) != 0));
  face->stream = (FT_Stream)0x0;
  if (face->internal != (FT_Face_Internal)0x0) {
    ft_mem_free(memory,face->internal);
    face->internal = (FT_Face_Internal)0x0;
  }
  ft_mem_free(memory,face);
  return;
}

Assistant:

static void
  destroy_face( FT_Memory  memory,
                FT_Face    face,
                FT_Driver  driver )
  {
    FT_Driver_Class  clazz = driver->clazz;


    /* discard auto-hinting data */
    if ( face->autohint.finalizer )
      face->autohint.finalizer( face->autohint.data );

    /* Discard glyph slots for this face.                           */
    /* Beware!  FT_Done_GlyphSlot() changes the field `face->glyph' */
    while ( face->glyph )
      FT_Done_GlyphSlot( face->glyph );

    /* discard all sizes for this face */
    FT_List_Finalize( &face->sizes_list,
                      (FT_List_Destructor)destroy_size,
                      memory,
                      driver );
    face->size = NULL;

    /* now discard client data */
    if ( face->generic.finalizer )
      face->generic.finalizer( face );

    /* discard charmaps */
    destroy_charmaps( face, memory );

    /* finalize format-specific stuff */
    if ( clazz->done_face )
      clazz->done_face( face );

    /* close the stream for this face if needed */
    FT_Stream_Free(
      face->stream,
      ( face->face_flags & FT_FACE_FLAG_EXTERNAL_STREAM ) != 0 );

    face->stream = NULL;

    /* get rid of it */
    if ( face->internal )
    {
      FT_FREE( face->internal );
    }
    FT_FREE( face );
  }